

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaNf.c
# Opt level: O2

int Nf_ManExtractWindow(void *pMan,Vec_Int_t *vRoots,Vec_Wec_t *vCuts,Vec_Wec_t *vObjCuts,
                       Vec_Int_t *vSolCuts,Vec_Int_t *vCutGates,Vec_Wrd_t *vCutAreas,word *pInvArea,
                       int StartVar,int nVars)

{
  uint uVar1;
  Vec_Wec_t *p;
  uint *puVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  int Entry;
  Gia_Obj_t *pGVar10;
  Nf_Mat_t *pNVar11;
  Vec_Int_t *pVVar12;
  uint *pCutSet;
  Vec_Int_t *p_00;
  uint uVar13;
  int iVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  long lVar18;
  byte bVar19;
  Gia_Man_t *pGVar20;
  uint *pCut;
  bool bVar21;
  int iCutInv [2];
  Nf_Mat_t *pM [2];
  Vec_Int_t *vObj [2];
  
  pGVar20 = *pMan;
  uVar4 = pGVar20->vCis->nSize;
  uVar3 = Gia_ManAndNum(pGVar20);
  uVar13 = uVar4 + uVar3 * 2;
  if (nVars < (int)uVar13) {
    printf("The number of variables is too large: 2*%d + %d = %d > %d.\n",(ulong)uVar3,(ulong)uVar4,
           (ulong)uVar13,(ulong)(uint)nVars);
    uVar4 = 0;
  }
  else {
    iVar14 = uVar4 * 2 + 2;
    *pInvArea = *(word *)((long)pMan + 0xd0);
    vRoots->nSize = 0;
    iVar16 = 0;
    while ((iVar16 < pGVar20->vCos->nSize &&
           (pGVar10 = Gia_ManCo(pGVar20,iVar16), pGVar10 != (Gia_Obj_t *)0x0))) {
      if ((~*(uint *)(pGVar10 + -(ulong)((uint)*(undefined8 *)pGVar10 & 0x1fffffff)) & 0x9fffffff)
          == 0) {
        __assert_fail("!Gia_ObjIsCi(Gia_ObjFanin0(pObj))",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                      ,0x89d,
                      "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                     );
      }
      iVar5 = Gia_ObjFaninId0p(*pMan,pGVar10);
      iVar5 = Abc_Var2Lit(iVar5,*(uint *)pGVar10 >> 0x1d & 1);
      Vec_IntPush(vRoots,iVar5 - iVar14);
      iVar16 = iVar16 + 1;
      pGVar20 = *pMan;
    }
    Vec_WecClear(vCuts);
    Vec_WecClear(vObjCuts);
    vSolCuts->nSize = 0;
    vCutGates->nSize = 0;
    vCutAreas->nSize = 0;
    for (uVar3 = 0; pGVar20 = *pMan, (int)uVar3 < pGVar20->nObjs; uVar3 = uVar3 + 1) {
      pGVar10 = Gia_ManObj(pGVar20,uVar3);
      if ((~*(uint *)pGVar10 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar10) {
        iCutInv[0] = -1;
        iCutInv[1] = -1;
        pM[0] = (Nf_Mat_t *)0x0;
        pM[1] = (Nf_Mat_t *)0x0;
        for (lVar18 = 0; iVar16 = (int)lVar18, lVar18 != 2; lVar18 = lVar18 + 1) {
          iVar5 = Nf_ObjMapRefNum((Nf_Man_t *)pMan,uVar3,iVar16);
          if (iVar5 != 0) {
            pNVar11 = Nf_ObjMatchBest((Nf_Man_t *)pMan,uVar3,iVar16);
            if ((pNVar11->field_0x3 & 0x40) == 0) {
              pNVar11 = Nf_ObjMatchBest((Nf_Man_t *)pMan,uVar3,iVar16);
              pM[lVar18] = pNVar11;
            }
            else {
              if (iCutInv[lVar18] != -1) {
                __assert_fail("iCutInv[c] == -1",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x8b4,
                              "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                             );
              }
              iCutInv[lVar18] = vSolCuts->nSize;
              Vec_IntPush(vSolCuts,-1);
            }
          }
        }
        if (vObjCuts->nSize != uVar3 * 2 - iVar14) {
          __assert_fail("Vec_WecSize(vObjCuts) == 2*iObj-LitShift",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x8bc,
                        "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                       );
        }
        for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
          pVVar12 = Vec_WecPushLevel(vObjCuts);
          vObj[lVar18] = pVVar12;
          iVar16 = Abc_Var2Lit(uVar3,(int)lVar18);
          iVar16 = Abc_Var2Lit(iVar16 - iVar14,1);
          Vec_IntPush(pVVar12,iVar16);
        }
        pCutSet = (uint *)Nf_ObjCutSet((Nf_Man_t *)pMan,uVar3);
        puVar2 = pCutSet;
        for (iVar16 = 0; pCut = puVar2 + 1, iVar16 < (int)*pCutSet; iVar16 = iVar16 + 1) {
          uVar13 = *pCut & 0x1f;
          if ((uVar13 == 1) && (puVar2[2] == uVar3)) {
            __assert_fail("!Nf_CutIsTriv(pCut, iObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                          ,0x8c6,
                          "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                         );
          }
          if (**(int **)((long)pMan + 8) < (int)uVar13) {
            __assert_fail("Nf_CutSize(pCut) <= p->pPars->nLutSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                          ,0x8c7,
                          "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                         );
          }
          iVar5 = Abc_Lit2Var(*pCut >> 5);
          if (iVar5 < *(int *)(*(long *)((long)pMan + 0x18) + 4)) {
            uVar13 = *pCut & 0x1f;
            uVar17 = *pCut >> 5;
            uVar6 = Abc_LitIsCompl(uVar17);
            p = *(Vec_Wec_t **)((long)pMan + 0x18);
            iVar5 = Abc_Lit2Var(uVar17);
            pVVar12 = Vec_WecEntry(p,iVar5);
            for (uVar17 = 0; (int)(uVar17 | 1) < pVVar12->nSize; uVar17 = uVar17 + 2) {
              uVar7 = Vec_IntEntry(pVVar12,uVar17);
              uVar8 = Vec_IntEntry(pVVar12,uVar17 | 1);
              lVar18 = *(long *)((long)pMan + 0x20);
              if (uVar13 != *(uint *)(lVar18 + 0x10 + (long)(int)uVar7 * 0x50) >> 0x1c) {
                __assert_fail("nFans == (int)pC->nFanins",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                              ,0x8d5,
                              "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                             );
              }
              uVar15 = uVar8 & 1 ^ uVar6;
              Vec_IntPush(vCutGates,uVar7);
              Vec_WrdPush(vCutAreas,*(word *)(lVar18 + (long)(int)uVar7 * 0x50 + 0x18));
              for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
                pNVar11 = pM[lVar18];
                if ((((pNVar11 != (Nf_Mat_t *)0x0) &&
                     (uVar1 = *(uint *)pNVar11, uVar9 = Nf_CutHandle((int *)pCutSet,(int *)pCut),
                     (uVar1 >> 0x14 & 0x3ff) == uVar9)) && ((*(uint *)pNVar11 & 0xfffff) == uVar7))
                   && (pNVar11->Cfg == (Nf_Cfg_t)(uVar8 & 0xfffffffe))) {
                  Vec_IntPush(vSolCuts,vCuts->nSize);
                }
              }
              bVar19 = 0;
              iVar5 = Abc_Var2Lit(vCuts->nSize + StartVar,0);
              p_00 = Vec_WecPushLevel(vCuts);
              Entry = Abc_Var2Lit(uVar3,uVar15);
              Vec_IntPush(p_00,Entry);
              Vec_IntPush(vObj[uVar15],iVar5);
              for (uVar7 = 0; uVar13 != uVar7; uVar7 = uVar7 + 1) {
                uVar15 = (uint)(((uVar8 >> 1 & 0x7f) >> (uVar7 & 0x1f) & 1) != 0);
                if (((int)uVar4 < (int)puVar2[(ulong)((uVar8 >> 8) >> (bVar19 & 0x1f) & 0xf) + 2])
                   || (bVar21 = uVar15 != 0, uVar15 = 1, bVar21)) {
                  iVar5 = Abc_Var2Lit(puVar2[(ulong)((uVar8 >> 8) >> (bVar19 & 0x1f) & 0xf) + 2],
                                      uVar15);
                  Vec_IntPush(p_00,iVar5);
                }
                bVar19 = bVar19 + 4;
              }
            }
          }
          puVar2 = pCut + (*pCut & 0x1f);
        }
        if ((iCutInv[0] != -1) && (iCutInv[1] != -1)) {
          __assert_fail("iCutInv[0] == -1 || iCutInv[1] == -1",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                        ,0x8f6,
                        "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                       );
        }
        for (lVar18 = 0; lVar18 != 2; lVar18 = lVar18 + 1) {
          if (iCutInv[lVar18] != -1) {
            Vec_IntWriteEntry(vSolCuts,iCutInv[lVar18],vCuts->nSize);
          }
          uVar13 = (uint)lVar18;
          iVar16 = Abc_Var2Lit(uVar3,uVar13);
          pVVar12 = Vec_WecEntry(vObjCuts,iVar16 - iVar14);
          iVar16 = Abc_Var2Lit(vCuts->nSize + StartVar,0);
          Vec_IntPush(pVVar12,iVar16);
          pVVar12 = Vec_WecPushLevel(vCuts);
          iVar16 = Abc_Var2Lit(uVar3,uVar13);
          Vec_IntPush(pVVar12,iVar16);
          iVar16 = Abc_Var2Lit(uVar3,uVar13 ^ 1);
          Vec_IntPush(pVVar12,iVar16);
          Vec_IntPush(vCutGates,3);
          Vec_WrdPush(vCutAreas,*(word *)((long)pMan + 0xd0));
        }
      }
    }
    iVar16 = 0;
    for (iVar14 = 0; iVar14 < pGVar20->vCis->nSize; iVar14 = iVar14 + 1) {
      pGVar10 = Gia_ManCi(pGVar20,iVar14);
      iVar5 = Gia_ObjId(pGVar20,pGVar10);
      if (iVar5 == 0) break;
      iVar5 = Nf_ObjMapRefNum((Nf_Man_t *)pMan,iVar5,1);
      if (iVar5 != 0) {
        iVar5 = Gia_ManAndNum(*pMan);
        Vec_IntPush(vSolCuts,iVar16 + iVar5 * -2);
      }
      pGVar20 = *pMan;
      iVar16 = iVar16 + -1;
    }
    if (vCuts->nSize != vCutGates->nSize) {
      __assert_fail("Vec_WecSize(vCuts) == Vec_IntSize(vCutGates)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90d,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
    if (vCuts->nSize != vCutAreas->nSize) {
      __assert_fail("Vec_WecSize(vCuts) == Vec_WrdSize(vCutAreas)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90e,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
    iVar14 = vObjCuts->nSize;
    iVar16 = Gia_ManAndNum(*pMan);
    if (iVar14 != iVar16 * 2) {
      __assert_fail("Vec_WecSize(vObjCuts) == 2*Gia_ManAndNum(p->pGia)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaNf.c"
                    ,0x90f,
                    "int Nf_ManExtractWindow(void *, Vec_Int_t *, Vec_Wec_t *, Vec_Wec_t *, Vec_Int_t *, Vec_Int_t *, Vec_Wrd_t *, word *, int, int)"
                   );
    }
  }
  return uVar4;
}

Assistant:

int Nf_ManExtractWindow( void * pMan, Vec_Int_t * vRoots, Vec_Wec_t * vCuts, Vec_Wec_t * vObjCuts, Vec_Int_t * vSolCuts, Vec_Int_t * vCutGates, Vec_Wrd_t * vCutAreas, word * pInvArea, int StartVar, int nVars )
{
    Nf_Man_t * p = (Nf_Man_t *)pMan;
    int nInputs = Gia_ManCiNum(p->pGia);
    int LitShift = 2*nInputs+2;
    Gia_Obj_t * pObj;
    int c, iObj;
    if ( 2*Gia_ManAndNum(p->pGia) + Gia_ManCiNum(p->pGia) > nVars )
    {
        printf( "The number of variables is too large: 2*%d + %d = %d > %d.\n", Gia_ManAndNum(p->pGia), Gia_ManCiNum(p->pGia), 2*Gia_ManAndNum(p->pGia) + Gia_ManCiNum(p->pGia), nVars );
        return 0;
    }
    *pInvArea = p->InvAreaW;
    // save roots
    Vec_IntClear( vRoots );
    Gia_ManForEachCo( p->pGia, pObj, c )
    {
        assert( !Gia_ObjIsCi(Gia_ObjFanin0(pObj)) );
        Vec_IntPush( vRoots, Gia_ObjFaninLit0p(p->pGia, pObj)-LitShift );
    }
    // prepare
    Vec_WecClear( vCuts );
    Vec_WecClear( vObjCuts );
    Vec_IntClear( vSolCuts );
    Vec_IntClear( vCutGates );
    Vec_WrdClear( vCutAreas );
    // collect cuts for each node
    Gia_ManForEachAndId( p->pGia, iObj )
    {
        Vec_Int_t * vObj[2], * vCutOne;
        int iCut, * pCut, * pCutSet;
        int iCutInv[2] = {-1, -1};
        // get matches
        Nf_Mat_t * pM[2] = {NULL, NULL};
        for ( c = 0; c < 2; c++ )
        {
            if ( Nf_ObjMapRefNum(p, iObj, c) == 0 )
                continue;
            if ( Nf_ObjMatchBest(p, iObj, c)->fCompl )
            {
                assert( iCutInv[c] == -1 );
                iCutInv[c] = Vec_IntSize(vSolCuts);
                Vec_IntPush( vSolCuts, -1 );
                continue;
            }
            pM[c] = Nf_ObjMatchBest(p, iObj, c);
        }
        // start collecting cuts of pos-obj and neg-obj
        assert( Vec_WecSize(vObjCuts) == 2*iObj-LitShift );
        for ( c = 0; c < 2; c++ )
        {
            vObj[c] = Vec_WecPushLevel( vObjCuts );
            Vec_IntPush( vObj[c], Abc_Var2Lit(Abc_Var2Lit(iObj, c)-LitShift, 1) );
        }
        // enumerate cuts
        pCutSet = Nf_ObjCutSet( p, iObj );
        Nf_SetForEachCut( pCutSet, pCut, iCut )
        {
            assert( !Nf_CutIsTriv(pCut, iObj) );
            assert( Nf_CutSize(pCut) <= p->pPars->nLutSize );
            if ( Abc_Lit2Var(Nf_CutFunc(pCut)) < Vec_WecSize(p->vTt2Match) )
            {
                int * pFans      = Nf_CutLeaves(pCut);
                int nFans        = Nf_CutSize(pCut);
                int iFuncLit     = Nf_CutFunc(pCut);
                int fComplExt    = Abc_LitIsCompl(iFuncLit);
                Vec_Int_t * vArr = Vec_WecEntry( p->vTt2Match, Abc_Lit2Var(iFuncLit) );
                int i, k, c, Info, Offset, iFanin, fComplF, iCutLit;
                Vec_IntForEachEntryDouble( vArr, Info, Offset, i )
                {
                    Nf_Cfg_t Cfg   = Nf_Int2Cfg(Offset);
                    int fCompl     = Cfg.fCompl ^ fComplExt;
                    Mio_Cell2_t*pC = Nf_ManCell( p, Info );
                    assert( nFans == (int)pC->nFanins );
                    Vec_IntPush( vCutGates, Info );
                    Vec_WrdPush( vCutAreas, pC->AreaW );
                    // to make comparison possible
                    Cfg.fCompl = 0;
                    // add solution cut
                    for ( c = 0; c < 2; c++ )
                    {
                        if ( pM[c] == NULL )
                            continue;
                        if ( (int)pM[c]->CutH == Nf_CutHandle(pCutSet, pCut) && (int)pM[c]->Gate == Info && Nf_Cfg2Int(pM[c]->Cfg) == Nf_Cfg2Int(Cfg) )
                        {
                            Vec_IntPush( vSolCuts, Vec_WecSize(vCuts) );
                            //printf( "adding solution for %d\n", Abc_Var2Lit(iObj, c)-LitShift );
                        }
                    }
                    // add new cut
                    iCutLit = Abc_Var2Lit( StartVar + Vec_WecSize(vCuts), 0 );
                    vCutOne = Vec_WecPushLevel( vCuts );
                    // add literals
                    Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, fCompl) );
                    Vec_IntPush( vObj[fCompl], iCutLit );
                    Nf_CfgForEachVarCompl( Cfg, nFans, iFanin, fComplF, k )
                        if ( pFans[iFanin] >= nInputs + 1 ) // internal node
                        {
                            Vec_IntPush( vCutOne, Abc_Var2Lit(pFans[iFanin], fComplF) );
                            //Vec_IntPush( Vec_WecEntry(vObjCuts, Abc_Var2Lit(pFans[iFanin], fComplF)-LitShift), iCutLit );
                        }
                        else if ( fComplF ) // complemented primary input
                            Vec_IntPush( vCutOne, Abc_Var2Lit(pFans[iFanin], 1) );
                } 
            }
        }
        assert( iCutInv[0] == -1 || iCutInv[1] == -1 );
        // add inverter cut
        for ( c = 0; c < 2; c++ )
        {
            if ( iCutInv[c] != -1 )
                Vec_IntWriteEntry( vSolCuts, iCutInv[c], Vec_WecSize(vCuts) );
            // the obj-lit implies its cut
            Vec_IntPush( Vec_WecEntry(vObjCuts, Abc_Var2Lit(iObj, c)-LitShift), Abc_Var2Lit(StartVar + Vec_WecSize(vCuts), 0) );
            // the cut includes both literals
            vCutOne = Vec_WecPushLevel( vCuts );
            Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, c) );
            Vec_IntPush( vCutOne, Abc_Var2Lit(iObj, !c) );
            Vec_IntPush( vCutGates, 3 );
            Vec_WrdPush( vCutAreas, p->InvAreaW );
        }
    }
//    for ( c = 0; c < p->nCells; c++ )
//        printf( "%d=%s ", c, p->pCells[c].pName );
//    printf( "\n" );
    // add complemented inputs
    Gia_ManForEachCiId( p->pGia, iObj, c )
        if ( Nf_ObjMapRefNum(p, iObj, 1) )
            Vec_IntPush( vSolCuts, -(2*Gia_ManAndNum(p->pGia)+c) );
    assert( Vec_WecSize(vCuts) == Vec_IntSize(vCutGates) );
    assert( Vec_WecSize(vCuts) == Vec_WrdSize(vCutAreas) );
    assert( Vec_WecSize(vObjCuts) == 2*Gia_ManAndNum(p->pGia) );
    return nInputs;
}